

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O2

Vec4 __thiscall
vkt::pipeline::anon_unknown_0::swizzleScaleBias
          (anon_unknown_0 *this,Vec4 *vec,VkComponentMapping *swz)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Vec4 VVar5;
  undefined1 *local_28;
  undefined4 local_20;
  undefined8 local_1c;
  undefined8 uStack_14;
  
  local_28 = &DAT_3f8000003f800000;
  local_20 = 0x3f800000;
  local_1c = *(undefined8 *)vec->m_data;
  uStack_14 = *(undefined8 *)(vec->m_data + 2);
  uVar1 = *(uint *)((long)&local_28 + (ulong)swz->r * 4);
  uVar2 = *(undefined4 *)((long)&local_28 + (ulong)swz->g * 4);
  uVar3 = *(undefined4 *)((long)&local_28 + (ulong)swz->b * 4);
  uVar4 = *(undefined4 *)((long)&local_28 + (ulong)swz->a * 4);
  *(uint *)this = uVar1;
  *(undefined4 *)(this + 4) = uVar2;
  *(undefined4 *)(this + 8) = uVar3;
  *(undefined4 *)(this + 0xc) = uVar4;
  VVar5.m_data[1] = 0.0;
  VVar5.m_data[0] = (float)uVar1;
  VVar5.m_data[2] = (float)uVar2;
  VVar5.m_data[3] = 0.0;
  return (Vec4)VVar5.m_data;
}

Assistant:

tcu::Vec4 swizzleScaleBias (const tcu::Vec4& vec, const vk::VkComponentMapping& swz)
{
	const float channelValues[] =
	{
		1.0f, // -1
		1.0f, // 0
		1.0f,
		vec.x(),
		vec.y(),
		vec.z(),
		vec.w()
	};

	return tcu::Vec4(channelValues[swz.r], channelValues[swz.g], channelValues[swz.b], channelValues[swz.a]);
}